

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O0

void __thiscall
StunMsg_RFC5769SampleIPv4Response_Test::TestBody(StunMsg_RFC5769SampleIPv4Response_Test *this)

{
  stun_msg_hdr *msg_hdr_00;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_420;
  Message local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_14;
  Message local_3f8;
  uint16_t local_3ee;
  stun_attr_type local_3ec;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_13;
  Message local_3d0;
  int local_3c8 [2];
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_12;
  Message local_3a8;
  uint16_t local_39e;
  stun_attr_type local_39c;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_11;
  Message local_380;
  int local_378 [2];
  undefined1 local_370 [8];
  AssertionResult gtest_ar_10;
  Message local_358;
  uint16_t local_34a;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_9;
  Message local_330;
  int local_324;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_8;
  Message local_308;
  int local_300;
  stun_status_type local_2fc;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_7;
  sockaddr_in test_addr;
  Message local_2d0;
  uint16_t local_2c6;
  stun_attr_type local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_290;
  Message local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__1;
  void *data;
  Message local_260;
  size_t local_258;
  unsigned_long local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_5;
  Message local_230;
  uint16_t local_226;
  stun_attr_type local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_4;
  stun_attr_hdr *attr_hdr;
  Message local_200;
  size_t local_1f8;
  unsigned_long local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_3;
  Message local_1d0;
  uint16_t local_1c6;
  stun_msg_type local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_190;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_;
  Message local_168;
  int local_160 [2];
  undefined1 local_158 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_140;
  Message local_138 [3];
  unsigned_long local_120 [2];
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  sockaddr_in ipv4;
  uint8_t tsx_id [12];
  stun_msg_hdr *msg_hdr;
  uint8_t buffer [80];
  uint8_t expected_result [80];
  char password [23];
  char software_name [12];
  StunMsg_RFC5769SampleIPv4Response_Test *this_local;
  
  stack0xffffffffffffffe0 = 0x6365762074736574;
  password[8] = 'W';
  password[9] = 'v';
  password[10] = 'J';
  password[0xb] = 'x';
  password[0xc] = 'B';
  password[0xd] = 't';
  password[0xe] = '\0';
  builtin_memcpy(expected_result + 0x48,"VOkJxbRl",8);
  password[0] = '1';
  password[1] = 'R';
  password[2] = 'm';
  password[3] = 'T';
  password[4] = 'x';
  password[5] = 'U';
  password[6] = 'k';
  password[7] = '/';
  expected_result[0x38] = '*';
  expected_result[0x39] = 0xf9;
  expected_result[0x3a] = 0xba;
  expected_result[0x3b] = 'S';
  expected_result[0x3c] = 0xf0;
  expected_result[0x3d] = 'k';
  expected_result[0x3e] = 0xe7;
  expected_result[0x3f] = 0xd7;
  expected_result[0x40] = 0x80;
  expected_result[0x41] = '(';
  expected_result[0x42] = '\0';
  expected_result[0x43] = '\x04';
  expected_result[0x44] = 0xc0;
  expected_result[0x45] = '}';
  expected_result[0x46] = 'L';
  expected_result[0x47] = 0x96;
  expected_result[0x28] = '\0';
  expected_result[0x29] = '\b';
  expected_result[0x2a] = '\0';
  expected_result[0x2b] = '\x14';
  expected_result[0x2c] = '+';
  expected_result[0x2d] = 0x91;
  expected_result[0x2e] = 0xf5;
  expected_result[0x2f] = 0x99;
  expected_result[0x30] = 0xfd;
  expected_result[0x31] = 0x9e;
  expected_result[0x32] = 0x90;
  expected_result[0x33] = 0xc3;
  expected_result[0x34] = 0x8c;
  expected_result[0x35] = 't';
  expected_result[0x36] = 0x89;
  expected_result[0x37] = 0xf9;
  builtin_memcpy(expected_result + 0x18,"tor ",5);
  expected_result[0x1d] = ' ';
  expected_result[0x1e] = '\0';
  expected_result[0x1f] = '\b';
  expected_result[0x20] = '\0';
  expected_result[0x21] = '\x01';
  expected_result[0x22] = 0xa1;
  expected_result[0x23] = 'G';
  expected_result[0x24] = 0xe1;
  expected_result[0x25] = '\x12';
  expected_result[0x26] = 0xa6;
  expected_result[0x27] = 'C';
  expected_result[8] = 0xfa;
  expected_result[9] = 0x87;
  expected_result[10] = 0xdf;
  expected_result[0xb] = 0xae;
  expected_result[0xc] = 0x80;
  expected_result[0xd] = '\"';
  expected_result[0xe] = '\0';
  expected_result[0xf] = '\v';
  expected_result[0x10] = 't';
  expected_result[0x11] = 'e';
  expected_result[0x12] = 's';
  expected_result[0x13] = 't';
  expected_result[0x14] = ' ';
  expected_result[0x15] = 'v';
  expected_result[0x16] = 'e';
  expected_result[0x17] = 'c';
  buffer[0x48] = '\x01';
  buffer[0x49] = '\x01';
  buffer[0x4a] = '\0';
  buffer[0x4b] = '<';
  buffer[0x4c] = '!';
  buffer[0x4d] = '\x12';
  buffer[0x4e] = 0xa4;
  buffer[0x4f] = 'B';
  expected_result[0] = 0xb7;
  expected_result[1] = 0xe7;
  expected_result[2] = 0xa7;
  expected_result[3] = '\x01';
  expected_result[4] = 0xbc;
  expected_result[5] = '4';
  expected_result[6] = 0xd6;
  expected_result[7] = 0x86;
  ipv4.sin_zero[0] = 0xb7;
  ipv4.sin_zero[1] = 0xe7;
  ipv4.sin_zero[2] = 0xa7;
  ipv4.sin_zero[3] = '\x01';
  ipv4.sin_zero[4] = 0xbc;
  ipv4.sin_zero[5] = '4';
  ipv4.sin_zero[6] = 0xd6;
  ipv4.sin_zero[7] = 0x86;
  gtest_ar.message_.ptr_._0_2_ = 2;
  gtest_ar.message_.ptr_._2_2_ = htons(0x8055);
  inet_pton(2,"192.0.2.1",(void *)((long)&gtest_ar.message_.ptr_ + 4));
  local_120[1] = 0x50;
  local_120[0] = 0x50;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_110,"sizeof(expected_result)","sizeof(buffer)",local_120 + 1,
             local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x106,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message(local_138);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_160[1] = 1;
    local_160[0] = stun_msg_verify((stun_msg_hdr *)(buffer + 0x48),0x50);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_158,"1",
               "stun_msg_verify((stun_msg_hdr*)expected_result, sizeof(expected_result))",
               local_160 + 1,local_160);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
    if (!bVar1) {
      testing::Message::Message(&local_168);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                 ,0x108,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_168);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_168);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      stun_msg_hdr_init((stun_msg_hdr *)&msg_hdr,0x101,ipv4.sin_zero);
      stun_attr_varsize_add((stun_msg_hdr *)&msg_hdr,0x8022,password + 0x10,0xb,' ');
      stun_attr_xor_sockaddr_add((stun_msg_hdr *)&msg_hdr,0x20,(sockaddr *)&gtest_ar.message_);
      stun_attr_msgint_add((stun_msg_hdr *)&msg_hdr,expected_result + 0x48,0x16);
      stun_attr_fingerprint_add((stun_msg_hdr *)&msg_hdr);
      anon_unknown.dwarf_39c4::IsEqual
                ((anon_unknown_dwarf_39c4 *)local_180,buffer + 0x48,&msg_hdr,0x50);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
      if (!bVar1) {
        testing::Message::Message(&local_188);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_2.message_,(internal *)local_180,
                   (AssertionResult *)"IsEqual(expected_result, buffer, sizeof(expected_result))",
                   "false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_190,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x113,pcVar2);
        testing::internal::AssertHelper::operator=(&local_190,&local_188);
        testing::internal::AssertHelper::~AssertHelper(&local_190);
        std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_188);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
      msg_hdr_00 = (stun_msg_hdr *)(buffer + 0x48);
      local_1c4 = STUN_BINDING_RESPONSE;
      local_1c6 = stun_msg_type(msg_hdr_00);
      testing::internal::EqHelper<false>::Compare<stun_msg_type,unsigned_short>
                ((EqHelper<false> *)local_1c0,"STUN_BINDING_RESPONSE","stun_msg_type(msg_hdr)",
                 &local_1c4,&local_1c6);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
      if (!bVar1) {
        testing::Message::Message(&local_1d0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x117,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_1d0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
      local_1f0 = 0x50;
      local_1f8 = stun_msg_len(msg_hdr_00);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_1e8,"sizeof(expected_result)","stun_msg_len(msg_hdr)",
                 &local_1f0,&local_1f8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
      if (!bVar1) {
        testing::Message::Message(&local_200);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&attr_hdr,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x118,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&attr_hdr,&local_200);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&attr_hdr);
        testing::Message::~Message(&local_200);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
      gtest_ar_4.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           stun_msg_next_attr(msg_hdr_00,(stun_attr_hdr *)0x0);
      local_224 = STUN_ATTR_SOFTWARE;
      local_226 = stun_attr_type((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<stun_attr_type,unsigned_short>
                ((EqHelper<false> *)local_220,"STUN_ATTR_SOFTWARE","stun_attr_type(attr_hdr)",
                 &local_224,&local_226);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
      if (!bVar1) {
        testing::Message::Message(&local_230);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x11b,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_230);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_230);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
      local_250 = 0xb;
      local_258 = stun_attr_len((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_248,"sizeof(software_name)-1","stun_attr_len(attr_hdr)",
                 &local_250,&local_258);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
      if (!bVar1) {
        testing::Message::Message(&local_260);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&data,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x11c,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&data,&local_260);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&data);
        testing::Message::~Message(&local_260);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        gtest_ar__1.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             stun_attr_varsize_read(gtest_ar_4.message_.ptr_);
        anon_unknown.dwarf_39c4::IsEqual
                  ((anon_unknown_dwarf_39c4 *)local_280,gtest_ar__1.message_.ptr_,password + 0x10,
                   0xb);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
        if (!bVar1) {
          testing::Message::Message(&local_288);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_6.message_,(internal *)local_280,
                     (AssertionResult *)"IsEqual(data, software_name, sizeof(software_name)-1)",
                     "false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_290,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x11e,pcVar2);
          testing::internal::AssertHelper::operator=(&local_290,&local_288);
          testing::internal::AssertHelper::~AssertHelper(&local_290);
          std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
          testing::Message::~Message(&local_288);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
        gtest_ar_4.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             stun_msg_next_attr(msg_hdr_00,gtest_ar_4.message_.ptr_);
        local_2c4 = STUN_ATTR_XOR_MAPPED_ADDRESS;
        local_2c6 = stun_attr_type((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<stun_attr_type,unsigned_short>
                  ((EqHelper<false> *)local_2c0,"STUN_ATTR_XOR_MAPPED_ADDRESS",
                   "stun_attr_type(attr_hdr)",&local_2c4,&local_2c6);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
        if (!bVar1) {
          testing::Message::Message(&local_2d0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)test_addr.sin_zero,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x121,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)test_addr.sin_zero,&local_2d0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)test_addr.sin_zero);
          testing::Message::~Message(&local_2d0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
        gtest_ar_7.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        test_addr.sin_family = 0;
        test_addr.sin_port = 0;
        test_addr.sin_addr.s_addr = 0;
        local_2fc = STUN_OK;
        local_300 = stun_attr_xor_sockaddr_read
                              ((stun_attr_xor_sockaddr *)gtest_ar_4.message_.ptr_,msg_hdr_00,
                               (sockaddr *)&gtest_ar_7.message_);
        testing::internal::EqHelper<false>::Compare<stun_status_type,int>
                  ((EqHelper<false> *)local_2f8,"STUN_OK",
                   "stun_attr_xor_sockaddr_read( (stun_attr_sockaddr*)attr_hdr, msg_hdr, (sockaddr*)&test_addr)"
                   ,&local_2fc,&local_300);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
        if (!bVar1) {
          testing::Message::Message(&local_308);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x125,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_8.message_,&local_308);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
          testing::Message::~Message(&local_308);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
        local_324 = 2;
        testing::internal::EqHelper<false>::Compare<int,unsigned_short>
                  ((EqHelper<false> *)local_320,"2","test_addr.sin_family",&local_324,
                   (unsigned_short *)&gtest_ar_7.message_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
        if (!bVar1) {
          testing::Message::Message(&local_330);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x126,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_9.message_,&local_330);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
          testing::Message::~Message(&local_330);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
        local_34a = htons(0x8055);
        testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
                  ((EqHelper<false> *)local_348,"htons(32853)","test_addr.sin_port",&local_34a,
                   (unsigned_short *)((long)&gtest_ar_7.message_.ptr_ + 2));
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
        if (!bVar1) {
          testing::Message::Message(&local_358);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x127,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_10.message_,&local_358);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
          testing::Message::~Message(&local_358);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
        local_378[1] = 0;
        local_378[0] = memcmp((void *)((long)&gtest_ar_7.message_.ptr_ + 4),
                              (void *)((long)&gtest_ar.message_.ptr_ + 4),4);
        testing::internal::EqHelper<true>::Compare<int,int>
                  ((char *)local_370,"0",
                   (int *)"memcmp(&test_addr.sin_addr, &ipv4.sin_addr, sizeof(ipv4.sin_addr))",
                   local_378 + 1,local_378);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
        if (!bVar1) {
          testing::Message::Message(&local_380);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x129,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_11.message_,&local_380);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
          testing::Message::~Message(&local_380);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
        gtest_ar_4.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             stun_msg_next_attr(msg_hdr_00,gtest_ar_4.message_.ptr_);
        local_39c = STUN_ATTR_MESSAGE_INTEGRITY;
        local_39e = stun_attr_type((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<stun_attr_type,unsigned_short>
                  ((EqHelper<false> *)local_398,"STUN_ATTR_MESSAGE_INTEGRITY",
                   "stun_attr_type(attr_hdr)",&local_39c,&local_39e);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
        if (!bVar1) {
          testing::Message::Message(&local_3a8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,300,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_12.message_,&local_3a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
          testing::Message::~Message(&local_3a8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
        local_3c8[1] = 1;
        local_3c8[0] = stun_attr_msgint_check
                                 ((stun_attr_msgint *)gtest_ar_4.message_.ptr_,msg_hdr_00,
                                  expected_result + 0x48,0x16);
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_3c0,"1",
                   "stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr, (uint8_t*)password, sizeof(password)-1)"
                   ,local_3c8 + 1,local_3c8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
        if (!bVar1) {
          testing::Message::Message(&local_3d0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x12e,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_13.message_,&local_3d0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
          testing::Message::~Message(&local_3d0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
        gtest_ar_4.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             stun_msg_next_attr(msg_hdr_00,gtest_ar_4.message_.ptr_);
        local_3ec = STUN_ATTR_FINGERPRINT;
        local_3ee = stun_attr_type((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<stun_attr_type,unsigned_short>
                  ((EqHelper<false> *)local_3e8,"STUN_ATTR_FINGERPRINT","stun_attr_type(attr_hdr)",
                   &local_3ec,&local_3ee);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
        if (!bVar1) {
          testing::Message::Message(&local_3f8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x131,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_14.message_,&local_3f8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
          testing::Message::~Message(&local_3f8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
        gtest_ar_4.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             stun_msg_next_attr(msg_hdr_00,gtest_ar_4.message_.ptr_);
        testing::internal::EqHelper<true>::Compare<_stun_attr_hdr_const>
                  ((EqHelper<true> *)local_410,"__null","attr_hdr",(Secret *)0x0,
                   (_stun_attr_hdr *)gtest_ar_4.message_.ptr_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
        if (!bVar1) {
          testing::Message::Message(&local_418);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
          testing::internal::AssertHelper::AssertHelper
                    (&local_420,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x134,pcVar2);
          testing::internal::AssertHelper::operator=(&local_420,&local_418);
          testing::internal::AssertHelper::~AssertHelper(&local_420);
          testing::Message::~Message(&local_418);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
      }
    }
  }
  return;
}

Assistant:

TEST(StunMsg, RFC5769SampleIPv4Response) {
  const char software_name[] = "test vector";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x01,0x01,0x00,0x3c, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x0b, //    SOFTWARE attribute header
    0x74,0x65,0x73,0x74, // }
    0x20,0x76,0x65,0x63, // }  UTF-8 server name
    0x74,0x6f,0x72,0x20, // }
    0x00,0x20,0x00,0x08, //    XOR-MAPPED-ADDRESS attribute header
    0x00,0x01,0xa1,0x47, //    Address family (IPv4) and xor'd mapped port number
    0xe1,0x12,0xa6,0x43, //    Xor'd mapped IPv4 address
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0x2b,0x91,0xf5,0x99, // }
    0xfd,0x9e,0x90,0xc3, // }
    0x8c,0x74,0x89,0xf9, // }  HMAC-SHA1 fingerprint
    0x2a,0xf9,0xba,0x53, // }
    0xf0,0x6b,0xe7,0xd7, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xc0,0x7d,0x4c,0x96, //    CRC32 fingerprint
  };

  uint8_t buffer[sizeof(stun_msg_hdr)
    + STUN_ATTR_VARSIZE_SIZE(sizeof(software_name)-1)
    + STUN_ATTR_SOCKADDR_SIZE(STUN_IPV4)
    + STUN_ATTR_MSGINT_SIZE
    + STUN_ATTR_UINT32_SIZE];

  stun_msg_hdr *msg_hdr = (stun_msg_hdr *)buffer;
  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  sockaddr_in ipv4;
  ipv4.sin_family = AF_INET;
  ipv4.sin_port = htons(32853);
  inet_pton(AF_INET, "192.0.2.1", &ipv4.sin_addr);

  ASSERT_EQ(sizeof(expected_result), sizeof(buffer));
  ASSERT_EQ(1, stun_msg_verify((stun_msg_hdr*)expected_result,
      sizeof(expected_result)));

  stun_msg_hdr_init(msg_hdr, STUN_BINDING_RESPONSE, tsx_id);
  stun_attr_varsize_add(msg_hdr, STUN_ATTR_SOFTWARE, software_name,
      sizeof(software_name)-1, ' ');
  stun_attr_xor_sockaddr_add(msg_hdr, STUN_ATTR_XOR_MAPPED_ADDRESS,
      (sockaddr*)&ipv4);
  stun_attr_msgint_add(msg_hdr, password, sizeof(password)-1);
  stun_attr_fingerprint_add(msg_hdr);

  EXPECT_TRUE(IsEqual(expected_result, buffer,
      sizeof(expected_result)));

  // Now decoding
  msg_hdr = (stun_msg_hdr *)expected_result;
  EXPECT_EQ(STUN_BINDING_RESPONSE, stun_msg_type(msg_hdr));
  EXPECT_EQ(sizeof(expected_result), stun_msg_len(msg_hdr));

  const stun_attr_hdr *attr_hdr = stun_msg_next_attr(msg_hdr, NULL);
  EXPECT_EQ(STUN_ATTR_SOFTWARE, stun_attr_type(attr_hdr));
  ASSERT_EQ(sizeof(software_name)-1, stun_attr_len(attr_hdr));
  const void* data = stun_attr_varsize_read((stun_attr_varsize*)attr_hdr);
  EXPECT_TRUE(IsEqual(data, software_name, sizeof(software_name)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_XOR_MAPPED_ADDRESS, stun_attr_type(attr_hdr));
  sockaddr_in test_addr;
  memset(&test_addr, 0, sizeof(test_addr));
  EXPECT_EQ(STUN_OK, stun_attr_xor_sockaddr_read(
      (stun_attr_sockaddr*)attr_hdr, msg_hdr, (sockaddr*)&test_addr));
  EXPECT_EQ(AF_INET, test_addr.sin_family);
  EXPECT_EQ(htons(32853), test_addr.sin_port);
  EXPECT_EQ(0, memcmp(&test_addr.sin_addr, &ipv4.sin_addr,
      sizeof(ipv4.sin_addr)));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_MESSAGE_INTEGRITY, stun_attr_type(attr_hdr));
  EXPECT_EQ(1, stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr,
      (uint8_t*)password, sizeof(password)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_FINGERPRINT, stun_attr_type(attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(NULL, attr_hdr);
}